

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopStyleColor(int count)

{
  ImVector<ImGuiColorMod> *this;
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  ImGuiColorMod *pIVar6;
  
  pIVar5 = GImGui;
  this = &GImGui->ColorStack;
  for (; 0 < count; count = count + -1) {
    pIVar6 = ImVector<ImGuiColorMod>::back(this);
    fVar2 = (pIVar6->BackupValue).y;
    fVar3 = (pIVar6->BackupValue).z;
    fVar4 = (pIVar6->BackupValue).w;
    pIVar1 = (pIVar5->Style).Colors + pIVar6->Col;
    pIVar1->x = (pIVar6->BackupValue).x;
    pIVar1->y = fVar2;
    pIVar1->z = fVar3;
    pIVar1->w = fVar4;
    ImVector<ImGuiColorMod>::pop_back(this);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorStack.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorStack.pop_back();
        count--;
    }
}